

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::dump_escaped(serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *this,string_t *s,bool ensure_ascii)

{
  byte byte_00;
  value_type_conflict2 vVar1;
  uint8_t uVar2;
  ulong uVar3;
  byte *pbVar4;
  pointer pvVar5;
  size_type sVar6;
  element_type *peVar7;
  char *pcVar8;
  size_t sVar9;
  type_error *ptVar10;
  value_type_conflict2 *pvVar11;
  reference pvVar12;
  string local_148 [39];
  allocator local_121;
  string local_120 [8];
  string sn_1;
  __cxx11 local_f8 [32];
  char local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [55];
  allocator local_61;
  string local_60 [8];
  string sn;
  ulong uStack_38;
  uint8_t byte;
  size_t i;
  size_t bytes;
  uint local_20;
  uint8_t state;
  uint32_t codepoint;
  bool ensure_ascii_local;
  string_t *s_local;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  bytes._7_1_ = '\0';
  i = 0;
  uStack_38 = 0;
  state = ensure_ascii;
  _codepoint = s;
  s_local = (string_t *)this;
  do {
    uVar3 = std::__cxx11::string::size();
    if (uVar3 <= uStack_38) {
      if (bytes._7_1_ == '\0') {
        if (i != 0) {
          peVar7 = std::
                   __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          pvVar5 = std::array<char,_512UL>::data(&this->string_buffer);
          (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,pvVar5,i);
        }
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_120,3,'\0',&local_121);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_120);
      sVar9 = std::__cxx11::string::size();
      pbVar4 = (byte *)std::__cxx11::string::back();
      snprintf(pcVar8,sVar9,"%.2X",(ulong)*pbVar4);
      ptVar10 = (type_error *)__cxa_allocate_exception(0x20);
      std::operator+((char *)local_148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "incomplete UTF-8 string; last byte: 0x");
      type_error::create(ptVar10,0x13c,local_148);
      __cxa_throw(ptVar10,&type_error::typeinfo,type_error::~type_error);
    }
    pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)_codepoint);
    byte_00 = *pbVar4;
    uVar2 = decode((uint8_t *)((long)&bytes + 7),&local_20,byte_00);
    if (uVar2 == '\0') {
      if (local_20 == 8) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = 'b';
        i = i + 2;
      }
      else if (local_20 == 9) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = 't';
        i = i + 2;
      }
      else if (local_20 == 10) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = 'n';
        i = i + 2;
      }
      else if (local_20 == 0xc) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = 'f';
        i = i + 2;
      }
      else if (local_20 == 0xd) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = 'r';
        i = i + 2;
      }
      else if (local_20 == 0x22) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = '\"';
        i = i + 2;
      }
      else if (local_20 == 0x5c) {
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = '\\';
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i + 1);
        *pvVar12 = '\\';
        i = i + 2;
      }
      else if ((local_20 < 0x20) || (((state & 1) != 0 && (0x7e < local_20)))) {
        if (local_20 < 0x10000) {
          pvVar5 = std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar5 + i,7,"\\u%04x",(ulong)(local_20 & 0xffff));
          i = i + 6;
        }
        else {
          pvVar5 = std::array<char,_512UL>::data(&this->string_buffer);
          snprintf(pvVar5 + i,0xd,"\\u%04x\\u%04x",(ulong)((local_20 >> 10) + 0xd7c0 & 0xffff),
                   (ulong)((local_20 & 0x3ff) + 0xdc00 & 0xffff));
          i = i + 0xc;
        }
      }
      else {
        pvVar11 = (value_type_conflict2 *)std::__cxx11::string::operator[]((ulong)_codepoint);
        vVar1 = *pvVar11;
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = vVar1;
        i = i + 1;
      }
      sVar6 = std::array<char,_512UL>::size(&this->string_buffer);
      if (sVar6 - i < 0xd) {
        peVar7 = std::
                 __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pvVar5 = std::array<char,_512UL>::data(&this->string_buffer);
        (*peVar7->_vptr_output_adapter_protocol[1])(peVar7,pvVar5,i);
        i = 0;
      }
    }
    else {
      if (uVar2 == '\x01') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_60,3,'\0',&local_61);
        std::allocator<char>::~allocator((allocator<char> *)&local_61);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
        sVar9 = std::__cxx11::string::size();
        snprintf(pcVar8,sVar9,"%.2X",(ulong)byte_00);
        ptVar10 = (type_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::to_string(local_f8,uStack_38);
        std::operator+(local_d8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )"invalid UTF-8 byte at index ");
        std::operator+(local_b8,local_d8);
        std::operator+(local_98,local_b8);
        type_error::create(ptVar10,0x13c,local_98);
        __cxa_throw(ptVar10,&type_error::typeinfo,type_error::~type_error);
      }
      if ((state & 1) == 0) {
        pvVar11 = (value_type_conflict2 *)std::__cxx11::string::operator[]((ulong)_codepoint);
        vVar1 = *pvVar11;
        pvVar12 = std::array<char,_512UL>::operator[](&this->string_buffer,i);
        *pvVar12 = vVar1;
        i = i + 1;
      }
    }
    uStack_38 = uStack_38 + 1;
  } while( true );
}

Assistant:

void dump_escaped(const string_t& s, const bool ensure_ascii)
    {
        uint32_t codepoint;
        uint8_t state = UTF8_ACCEPT;
        std::size_t bytes = 0;  // number of bytes written to string_buffer

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            const auto byte = static_cast<uint8_t>(s[i]);

            switch (decode(state, codepoint, byte))
            {
                case UTF8_ACCEPT:  // decode found a new code point
                {
                    switch (codepoint)
                    {
                        case 0x08: // backspace
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'b';
                            break;
                        }

                        case 0x09: // horizontal tab
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 't';
                            break;
                        }

                        case 0x0A: // newline
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'n';
                            break;
                        }

                        case 0x0C: // formfeed
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'f';
                            break;
                        }

                        case 0x0D: // carriage return
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = 'r';
                            break;
                        }

                        case 0x22: // quotation mark
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\"';
                            break;
                        }

                        case 0x5C: // reverse solidus
                        {
                            string_buffer[bytes++] = '\\';
                            string_buffer[bytes++] = '\\';
                            break;
                        }

                        default:
                        {
                            // escape control characters (0x00..0x1F) or, if
                            // ensure_ascii parameter is used, non-ASCII characters
                            if ((codepoint <= 0x1F) or (ensure_ascii and (codepoint >= 0x7F)))
                            {
                                if (codepoint <= 0xFFFF)
                                {
                                    std::snprintf(string_buffer.data() + bytes, 7, "\\u%04x",
                                                  static_cast<uint16_t>(codepoint));
                                    bytes += 6;
                                }
                                else
                                {
                                    std::snprintf(string_buffer.data() + bytes, 13, "\\u%04x\\u%04x",
                                                  static_cast<uint16_t>(0xD7C0 + (codepoint >> 10)),
                                                  static_cast<uint16_t>(0xDC00 + (codepoint & 0x3FF)));
                                    bytes += 12;
                                }
                            }
                            else
                            {
                                // copy byte to buffer (all previous bytes
                                // been copied have in default case above)
                                string_buffer[bytes++] = s[i];
                            }
                            break;
                        }
                    }

                    // write buffer and reset index; there must be 13 bytes
                    // left, as this is the maximal number of bytes to be
                    // written ("\uxxxx\uxxxx\0") for one code point
                    if (string_buffer.size() - bytes < 13)
                    {
                        o->write_characters(string_buffer.data(), bytes);
                        bytes = 0;
                    }
                    break;
                }

                case UTF8_REJECT:  // decode found invalid UTF-8 byte
                {
                    std::string sn(3, '\0');
                    snprintf(&sn[0], sn.size(), "%.2X", byte);
                    JSON_THROW(type_error::create(316, "invalid UTF-8 byte at index " + std::to_string(i) + ": 0x" + sn));
                }

                default:  // decode found yet incomplete multi-byte code point
                {
                    if (not ensure_ascii)
                    {
                        // code point will not be escaped - copy byte to buffer
                        string_buffer[bytes++] = s[i];
                    }
                    break;
                }
            }
        }

        if (JSON_LIKELY(state == UTF8_ACCEPT))
        {
            // write buffer
            if (bytes > 0)
            {
                o->write_characters(string_buffer.data(), bytes);
            }
        }
        else
        {
            // we finish reading, but do not accept: string was incomplete
            std::string sn(3, '\0');
            snprintf(&sn[0], sn.size(), "%.2X", static_cast<uint8_t>(s.back()));
            JSON_THROW(type_error::create(316, "incomplete UTF-8 string; last byte: 0x" + sn));
        }
    }